

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall database::Query::_ParseQueryString(Query *this)

{
  anon_class_8_1_8991fb9c local_188;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_180;
  anon_class_8_1_8991fb9c local_160;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
  local_158;
  anon_class_8_1_8991fb9c local_138;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_130;
  anon_class_8_1_8991fb9c local_110;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
  local_108;
  anon_class_8_1_8991fb9c local_e8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
  local_e0;
  anon_class_8_1_8991fb9c local_c0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
  local_b8;
  anon_class_8_1_8991fb9c local_98;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_90;
  anon_class_8_1_8991fb9c local_70;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>_&)>
  local_68;
  undefined1 local_38 [8];
  pair<database::TransactionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_order_filter_result;
  Query *this_local;
  
  first_order_filter_result.second.field_2._8_8_ = this;
  _Transaction_Filter((pair<database::TransactionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_38,(string *)this);
  *(undefined4 *)(this + 0x24) = local_38._0_4_;
  if (*(int *)(this + 0x24) == 0) {
    *(undefined4 *)(this + 0x20) = 0;
    std::__cxx11::string::operator=((string *)(this + 0x28),(string *)&first_order_filter_result);
  }
  else if (*(int *)(this + 0x24) == 1) {
    *(undefined4 *)(this + 0x20) = 0;
    local_70.this = this;
    std::
    function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,database::QueryDataType,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,database::QueryDataType>>>const&)>
    ::function<database::Query::_ParseQueryString()::__0,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,database::QueryDataType,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,database::QueryDataType>>>const&)>
                *)&local_68,&local_70);
    _ParseCreateContainerQuery((string *)&first_order_filter_result,&local_68);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>_&)>
    ::~function(&local_68);
  }
  else if (*(int *)(this + 0x24) == 2) {
    *(undefined4 *)(this + 0x20) = 1;
    local_98.this = this;
    std::
    function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)>
    ::function<database::Query::_ParseQueryString()::__1,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)>
                *)&local_90,&local_98);
    _ParseInsertIntoContainerQuery((string *)&first_order_filter_result,&local_90);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::~function(&local_90);
  }
  else if (*(int *)(this + 0x24) == 3) {
    *(undefined4 *)(this + 0x20) = 1;
    local_c0.this = this;
    std::
    function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>const&)>
    ::function<database::Query::_ParseQueryString()::__2,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>const&)>
                *)&local_b8,&local_c0);
    _ParseSelectAllFromContainerQuery((string *)&first_order_filter_result,&local_b8);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
    ::~function(&local_b8);
  }
  else if (*(int *)(this + 0x24) == 4) {
    *(undefined4 *)(this + 0x20) = 1;
    local_e8.this = this;
    std::
    function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>const&)>
    ::function<database::Query::_ParseQueryString()::__3,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>const&)>
                *)&local_e0,&local_e8);
    _ParseSelectDataSetFromContainerQuery((string *)&first_order_filter_result,&local_e0);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
    ::~function(&local_e0);
  }
  else if (*(int *)(this + 0x24) == 5) {
    *(undefined4 *)(this + 0x20) = 1;
    local_110.this = this;
    std::
    function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>const&)>
    ::function<database::Query::_ParseQueryString()::__4,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>const&)>
                *)&local_108,&local_110);
    _ParseUpdateContainerQuery((string *)&first_order_filter_result,&local_108);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
    ::~function(&local_108);
  }
  else if (*(int *)(this + 0x24) == 6) {
    *(undefined4 *)(this + 0x20) = 1;
    local_138.this = this;
    std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
    function<database::Query::_ParseQueryString()::__5,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_130
               ,&local_138);
    _ParseTruncateContainerQuery((string *)&first_order_filter_result,&local_130);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_130);
  }
  else if (*(int *)(this + 0x24) == 7) {
    *(undefined4 *)(this + 0x20) = 1;
    local_160.this = this;
    std::
    function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>&)>
    ::function<database::Query::_ParseQueryString()::__6,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>&)>
                *)&local_158,&local_160);
    _ParseDeleteFromContainerQuery((string *)&first_order_filter_result,&local_158);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
    ::~function(&local_158);
  }
  else if (*(int *)(this + 0x24) == 8) {
    *(undefined4 *)(this + 0x20) = 0;
    local_188.this = this;
    std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
    function<database::Query::_ParseQueryString()::__7,void>
              ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_180
               ,&local_188);
    _ParseDropContainerQuery((string *)&first_order_filter_result,&local_180);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_180);
  }
  else if (*(int *)(this + 0x24) == 9) {
    *(undefined4 *)(this + 0x20) = 0;
    std::__cxx11::string::operator=((string *)(this + 0x28),(string *)&first_order_filter_result);
  }
  std::
  pair<database::TransactionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<database::TransactionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_38);
  return;
}

Assistant:

void database::Query::_ParseQueryString()
{
  std::pair<database::TransactionType,std::string> first_order_filter_result = _Transaction_Filter(m_query_string);
  m_transaction_type = first_order_filter_result.first;

  //Create Database
  if(m_transaction_type == database::create_database)
  {
    m_transaction_metatype = database::ddl;
    m_database_name = first_order_filter_result.second;
  }

  //Create Container
  else if(m_transaction_type == database::create_container)
  {
    m_transaction_metatype = database::ddl;
    _ParseCreateContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto schema){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_container_schema = schema;
    });
  }

  //Insert into Container
  else if(m_transaction_type == database::insert_into)
  {
    m_transaction_metatype = database::dml;
    _ParseInsertIntoContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto values){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_values = values;
    });
  }

  //Select All from Container
  else if(m_transaction_type == database::select_all)
  {
    m_transaction_metatype = database::dml;
    _ParseSelectAllFromContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto filter){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_filter = filter;
    });
  }

  //Select Dataset from Container
  else if(m_transaction_type == database::select_dataset)
  {
    m_transaction_metatype = database::dml;
    _ParseSelectDataSetFromContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto dataset, auto filter){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_dataset = dataset;
      m_filter = filter;
    });
  }

  //Update Container
  else if(m_transaction_type == database::update)
  {
    m_transaction_metatype = database::dml;
    _ParseUpdateContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto values,auto filter){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_values = values;
      m_filter = filter;
    });
  }

  //Truncate Container
  else if(m_transaction_type == database::truncate)
  {
    m_transaction_metatype = database::dml;
    _ParseTruncateContainerQuery(first_order_filter_result.second,[&](auto databaseName,auto containerName){
      m_database_name = databaseName;
      m_container_name = containerName;
    });
  }

  /*
  !ALTER CONTAINER  - not implemented
  TODO Need to implement the processing for alter container query
  */
  //Alter Container - To Be Adjusted Later
  // else if(m_transaction_type == database::alter)
  // {
  //   m_transaction_metatype = database::ddl;
  // }


  //Delete from Container
  else if(m_transaction_type == database::delete_from)
  {
    m_transaction_metatype = database::dml;
    _ParseDeleteFromContainerQuery(first_order_filter_result.second,[&](auto databaseName,auto containerName,auto filter) {
      m_database_name = databaseName;
      m_container_name = containerName;
      m_filter = filter;
    });
  }

  //Drop Container
  else if(m_transaction_type == database::drop_container)
  {
    m_transaction_metatype = database::ddl;
    _ParseDropContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName){
      m_database_name = databaseName;
      m_container_name = containerName;
    });
  }

  //Drop Database
  else if(m_transaction_type == database::drop_database)
  {
    m_transaction_metatype = database::ddl;
    m_database_name = first_order_filter_result.second;
  }
}